

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O1

void __thiscall fineftp::FtpSession::handleFtpCommandSYST(FtpSession *this,string *param_1)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"UNIX","");
  sendFtpMessage(this,NAME_SYSTEM_TYPE,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FtpSession::handleFtpCommandSYST(const std::string& /*param*/)
  {
    // Always returning "UNIX" when being asked for the operating system.
    // Some clients (Mozilla Firefox for example) may disconnect, when we
    // return an unknown operating system here. As depending on the Server's
    // operating system is a horrible feature anyways, we simply fake it.
    //
    // Unix should be the best compatible value here, as we emulate Unix-like
    // outputs for other commands (-> LIST) on all operating systems.
    sendFtpMessage(FtpReplyCode::NAME_SYSTEM_TYPE, "UNIX");
  }